

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_> * __thiscall
tinyusdz::GPrim::get_primvars
          (vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>
           *__return_storage_ptr__,GPrim *this)

{
  bool bVar1;
  reference ppVar2;
  allocator local_3f1;
  string local_3f0;
  string local_3d0;
  undefined1 local_3b0 [8];
  GeomPrimvar gprimvar;
  string local_88;
  allocator local_61;
  string local_60;
  reference local_40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
  *prop;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *__range1;
  GPrim *this_local;
  vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_> *gpvars;
  
  std::vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>::vector
            (__return_storage_ptr__);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin(&this->props);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end(&this->props);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&prop), bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
             ::operator*(&__end1);
    local_40 = ppVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"primvars:",&local_61);
    bVar1 = startsWith(&ppVar2->first,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    ppVar2 = local_40;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_88,":indices",
                 (allocator *)((long)&gprimvar._interpolation.contained + 3));
      bVar1 = endsWith(&ppVar2->first,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&gprimvar._interpolation.contained + 3));
      if (!bVar1) {
        GeomPrimvar::GeomPrimvar((GeomPrimvar *)local_3b0);
        ppVar2 = local_40;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3f0,"primvars:",&local_3f1);
        removePrefix(&local_3d0,&ppVar2->first,&local_3f0);
        bVar1 = get_primvar(this,&local_3d0,(GeomPrimvar *)local_3b0,(string *)0x0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        if (bVar1) {
          std::vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>::
          emplace_back<tinyusdz::GeomPrimvar>(__return_storage_ptr__,(GeomPrimvar *)local_3b0);
        }
        GeomPrimvar::~GeomPrimvar((GeomPrimvar *)local_3b0);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<GeomPrimvar> GPrim::get_primvars() const {
  std::vector<GeomPrimvar> gpvars;

  for (const auto &prop : props) {
    if (startsWith(prop.first, kPrimvars)) {
      // skip `:indices`. Attribute with `:indices` suffix is handled in
      // `get_primvar`
      // Also skips primvar attribute with `:indices` suffix only.
      if (endsWith(prop.first, kIndices)) {
        continue;
      }

      GeomPrimvar gprimvar;
      if (get_primvar(removePrefix(prop.first, kPrimvars), &gprimvar)) {
        gpvars.emplace_back(std::move(gprimvar));
      }
    }
  }

  return gpvars;
}